

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

uint32_t __thiscall spirv_cross::Compiler::expression_type_id(Compiler *this,uint32_t id)

{
  Types TVar1;
  Variant *pVVar2;
  SPIRExpression *pSVar3;
  SPIRConstantOp *pSVar4;
  SPIRConstant *pSVar5;
  TypeID *pTVar6;
  runtime_error *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pVVar2 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr;
  TVar1 = pVVar2[id].type;
  if (10 < TVar1 - TypeVariable) {
switchD_003337a0_caseD_4:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"Cannot resolve expression type.","");
    ::std::runtime_error::runtime_error(this_00,(string *)local_40);
    *(undefined ***)this_00 = &PTR__runtime_error_003fce08;
    __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  pVVar2 = pVVar2 + id;
  switch(TVar1) {
  case TypeVariable:
    pSVar5 = (SPIRConstant *)Variant::get<spirv_cross::SPIRVariable>(pVVar2);
    break;
  case TypeConstant:
    pSVar5 = Variant::get<spirv_cross::SPIRConstant>(pVVar2);
    break;
  default:
    goto switchD_003337a0_caseD_4;
  case TypeExpression:
    pSVar3 = Variant::get<spirv_cross::SPIRExpression>(pVVar2);
    pTVar6 = &pSVar3->expression_type;
    goto LAB_003337dd;
  case TypeConstantOp:
    pSVar4 = Variant::get<spirv_cross::SPIRConstantOp>(pVVar2);
    pTVar6 = &pSVar4->basetype;
    goto LAB_003337dd;
  case TypeCombinedImageSampler:
    pSVar5 = (SPIRConstant *)Variant::get<spirv_cross::SPIRCombinedImageSampler>(pVVar2);
    break;
  case TypeAccessChain:
    pSVar5 = (SPIRConstant *)Variant::get<spirv_cross::SPIRAccessChain>(pVVar2);
    break;
  case TypeUndef:
    pSVar5 = (SPIRConstant *)Variant::get<spirv_cross::SPIRUndef>(pVVar2);
  }
  pTVar6 = (TypeID *)&(pSVar5->super_IVariant).field_0xc;
LAB_003337dd:
  return pTVar6->id;
}

Assistant:

uint32_t Compiler::expression_type_id(uint32_t id) const
{
	switch (ir.ids[id].get_type())
	{
	case TypeVariable:
		return get<SPIRVariable>(id).basetype;

	case TypeExpression:
		return get<SPIRExpression>(id).expression_type;

	case TypeConstant:
		return get<SPIRConstant>(id).constant_type;

	case TypeConstantOp:
		return get<SPIRConstantOp>(id).basetype;

	case TypeUndef:
		return get<SPIRUndef>(id).basetype;

	case TypeCombinedImageSampler:
		return get<SPIRCombinedImageSampler>(id).combined_type;

	case TypeAccessChain:
		return get<SPIRAccessChain>(id).basetype;

	default:
		SPIRV_CROSS_THROW("Cannot resolve expression type.");
	}
}